

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O0

bool duckdb::Utf8Proc::CodepointToUtf8(int cp,int *sz,char *c)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *c_local;
  int *sz_local;
  int cp_local;
  
  bVar3 = (byte)cp;
  if (cp < 0x80) {
    *sz = 1;
    *c = bVar3;
  }
  else {
    bVar1 = (byte)(cp >> 6);
    if (cp < 0x800) {
      *sz = 2;
      *c = bVar1 - 0x40;
      c[1] = (bVar3 & 0x3f) + 0x80;
    }
    else {
      if ((0xd7ff < cp) && (cp < 0xe000)) {
        *sz = -1;
        return false;
      }
      bVar2 = (byte)(cp >> 0xc);
      if (cp < 0x10000) {
        *sz = 3;
        *c = bVar2 - 0x20;
        c[1] = (bVar1 & 0x3f) + 0x80;
        c[2] = (bVar3 & 0x3f) + 0x80;
      }
      else {
        if (0x10ffff < cp) {
          *sz = -1;
          return false;
        }
        *sz = 4;
        *c = (char)(cp >> 0x12) + -0x10;
        c[1] = (bVar2 & 0x3f) + 0x80;
        c[2] = (bVar1 & 0x3f) + 0x80;
        c[3] = (bVar3 & 0x3f) + 0x80;
      }
    }
  }
  return true;
}

Assistant:

bool Utf8Proc::CodepointToUtf8(int cp, int &sz, char *c) {
	if (cp <= 0x7F) {
		sz = 1;
		c[0] = cp;
	} else if (cp <= 0x7FF) {
		sz = 2;
		c[0] = (cp >> 6) + 192;
		c[1] = (cp & 63) + 128;
	} else if (0xd800 <= cp && cp <= 0xdfff) {
		sz = -1;
		// invalid block of utf
		return false;
	} else if (cp <= 0xFFFF) {
		sz = 3;
		c[0] = (cp >> 12) + 224;
		c[1] = ((cp >> 6) & 63) + 128;
		c[2] = (cp & 63) + 128;
	} else if (cp <= 0x10FFFF) {
		sz = 4;
		c[0] = (cp >> 18) + 240;
		c[1] = ((cp >> 12) & 63) + 128;
		c[2] = ((cp >> 6) & 63) + 128;
		c[3] = (cp & 63) + 128;
	} else {
		sz = -1;
		return false;
	}
	return true;
}